

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::init
          (TextureCubeArrayFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 z;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  RenderContext *pRVar5;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TextureCubeArray *pTVar6;
  TextureCubeArray *pTVar7;
  PixelBufferAccess *pPVar8;
  int *piVar9;
  RenderTarget *this_02;
  Vector<float,_2> local_518;
  Vector<float,_2> local_510;
  Vector<float,_2> local_508;
  FilterCase local_500;
  Vector<float,_2> local_4e0;
  Vector<float,_2> local_4d8;
  Vector<float,_2> local_4d0;
  FilterCase local_4c8;
  Vector<float,_2> local_4a8;
  Vector<float,_2> local_4a0;
  Vector<float,_2> local_498;
  FilterCase local_490;
  Vector<float,_2> local_470;
  Vector<float,_2> local_468;
  Vector<float,_2> local_460;
  FilterCase local_458;
  Vector<float,_2> local_438;
  Vector<float,_2> local_430;
  Vector<float,_2> local_428;
  FilterCase local_420;
  Vector<float,_2> local_400;
  Vector<float,_2> local_3f8;
  Vector<float,_2> local_3f0;
  FilterCase local_3e8;
  byte local_3c1;
  bool isSingleSample;
  Vector<float,_2> local_3b8;
  Vector<float,_2> local_3b0;
  FilterCase local_3a8;
  Vector<float,_2> local_388;
  Vector<float,_2> local_380;
  Vector<float,_2> local_378;
  FilterCase local_370;
  Vector<float,_2> local_350;
  Vector<float,_2> local_348;
  Vector<float,_2> local_340;
  FilterCase local_338;
  Vector<float,_2> local_318;
  Vector<float,_2> local_310;
  Vector<float,_2> local_308;
  FilterCase local_300;
  TextureCubeArray *local_2e0;
  TextureCubeArray *tex1;
  TextureCubeArray *tex0;
  Vector<float,_4> local_2bc;
  Vec4 local_2ac;
  RGBA local_29c;
  Vector<float,_4> local_298;
  Vector<float,_4> local_288;
  Vec4 local_278;
  PixelBufferAccess local_268;
  uint local_23c;
  uint local_238;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int layerFaceNdx_1;
  PixelBufferAccess levelBuf_1;
  int levelNdx_1;
  Vector<float,_4> local_1cc;
  Vector<float,_4> local_1bc;
  Vector<float,_4> local_1ac;
  undefined1 local_19c [8];
  Vec4 gMax;
  Vector<float,_4> local_17c;
  Vector<float,_4> local_16c;
  undefined1 local_15c [8];
  Vec4 gMin;
  IVec4 swz;
  int layerFaceNdx;
  PixelBufferAccess levelBuf;
  undefined1 local_108 [4];
  int levelNdx;
  IVec4 levelSwz [4];
  int numLayers;
  int numLevels;
  Vec4 cBias;
  Vec4 cScale;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  allocator<char> local_41;
  string local_40;
  deUint32 local_1c;
  ContextType local_18;
  undefined1 local_11;
  TextureCubeArrayFilteringCase *pTStack_10;
  bool supportsES32;
  TextureCubeArrayFilteringCase *this_local;
  
  pTStack_10 = this;
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_18.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::es(3,2);
  local_11 = glu::contextSupports(local_18,(ApiType)local_1c);
  if (!(bool)local_11) {
    this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_texture_cube_map_array");
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"GL_EXT_texture_cube_map_array not supported",&local_41);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_40);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  fmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)(cScale.m_data + 2),
             (TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  tcu::operator-((tcu *)(cBias.m_data + 2),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)(cScale.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&numLayers,(Vector<float,_4> *)(cScale.m_data + 2));
  iVar2 = ::deLog2Floor32(this->m_size);
  levelSwz[3].m_data[3] = iVar2 + 1;
  levelSwz[3].m_data[2] = this->m_depth / 6;
  pTVar6 = (TextureCubeArray *)operator_new(0x68);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TextureCubeArray::TextureCubeArray
            (pTVar6,pRVar5,this->m_internalFormat,this->m_size,this->m_depth);
  this->m_gradientTex = pTVar6;
  pTVar6 = (TextureCubeArray *)operator_new(0x68);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TextureCubeArray::TextureCubeArray
            (pTVar6,pRVar5,this->m_internalFormat,this->m_size,this->m_depth);
  this->m_gridTex = pTVar6;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_108,0,1,2,3);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(levelSwz[0].m_data + 2),2,1,3,0);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(levelSwz[1].m_data + 2),3,0,1,2);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(levelSwz[2].m_data + 2),1,3,2,0);
  for (levelBuf.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
      levelBuf.super_ConstPixelBufferAccess.m_data._4_4_ < levelSwz[3].m_data[3];
      levelBuf.super_ConstPixelBufferAccess.m_data._4_4_ =
           levelBuf.super_ConstPixelBufferAccess.m_data._4_4_ + 1) {
    pTVar7 = glu::TextureCubeArray::getRefTexture(this->m_gradientTex);
    tcu::TextureCubeArray::allocLevel(pTVar7,levelBuf.super_ConstPixelBufferAccess.m_data._4_4_);
    pTVar7 = glu::TextureCubeArray::getRefTexture(this->m_gradientTex);
    pPVar8 = tcu::TextureLevelPyramid::getLevel
                       (&pTVar7->super_TextureLevelPyramid,
                        levelBuf.super_ConstPixelBufferAccess.m_data._4_4_);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)(swz.m_data + 3),pPVar8);
    for (swz.m_data[2] = 0; swz.m_data[2] < this->m_depth; swz.m_data[2] = swz.m_data[2] + 1) {
      tcu::Vector<int,_4>::Vector
                ((Vector<int,_4> *)(gMin.m_data + 2),
                 (Vector<int,_4> *)(local_108 + (long)(swz.m_data[2] % 4) * 0x10));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),0.0,0.0,0.0,1.0);
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),0);
      iVar2 = *piVar9;
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),1);
      iVar3 = *piVar9;
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),2);
      iVar4 = *piVar9;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),3);
      tcu::Vector<float,_4>::swizzle(&local_17c,(int)&gMax + 8,iVar2,iVar3,iVar4);
      tcu::operator*((tcu *)&local_16c,&local_17c,(Vector<float,_4> *)(cBias.m_data + 2));
      tcu::operator+((tcu *)local_15c,&local_16c,(Vector<float,_4> *)&numLayers);
      tcu::Vector<float,_4>::Vector(&local_1cc,1.0,1.0,1.0,0.0);
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),0);
      iVar2 = *piVar9;
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),1);
      iVar3 = *piVar9;
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),2);
      iVar4 = *piVar9;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),3);
      tcu::Vector<float,_4>::swizzle(&local_1bc,(int)&local_1cc,iVar2,iVar3,iVar4);
      tcu::operator*((tcu *)&local_1ac,&local_1bc,(Vector<float,_4> *)(cBias.m_data + 2));
      tcu::operator+((tcu *)local_19c,&local_1ac,(Vector<float,_4> *)&numLayers);
      iVar2 = swz.m_data[2];
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)(swz.m_data + 3));
      iVar4 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)(swz.m_data + 3));
      tcu::getSubregion((PixelBufferAccess *)&stack0xfffffffffffffe08,
                        (PixelBufferAccess *)(swz.m_data + 3),0,0,iVar2,iVar3,iVar4,1);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)&stack0xfffffffffffffe08,(Vec4 *)local_15c,(Vec4 *)local_19c);
    }
  }
  for (levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
      levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_ < levelSwz[3].m_data[3];
      levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_ =
           levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_ + 1) {
    pTVar7 = glu::TextureCubeArray::getRefTexture(this->m_gridTex);
    tcu::TextureCubeArray::allocLevel(pTVar7,levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_);
    pTVar7 = glu::TextureCubeArray::getRefTexture(this->m_gridTex);
    pPVar8 = tcu::TextureLevelPyramid::getLevel
                       (&pTVar7->super_TextureLevelPyramid,
                        levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&step,pPVar8);
    for (rgb = 0; z = rgb, (int)rgb < this->m_depth; rgb = rgb + 1) {
      colorA = (deUint32)(0xffffff / (long)(levelSwz[3].m_data[3] * this->m_depth + -1));
      colorB = colorA * (levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_ +
                        rgb * levelSwz[3].m_data[3]);
      local_238 = colorB | 0xff000000;
      local_23c = ~colorB | 0xff000000;
      iVar2 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&step);
      iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&step);
      tcu::getSubregion(&local_268,(PixelBufferAccess *)&step,0,0,z,iVar2,iVar3,1);
      tcu::RGBA::RGBA(&local_29c,local_238);
      tcu::RGBA::toVec((RGBA *)&local_298);
      tcu::operator*((tcu *)&local_288,&local_298,(Vector<float,_4> *)(cBias.m_data + 2));
      tcu::operator+((tcu *)&local_278,&local_288,(Vector<float,_4> *)&numLayers);
      tcu::RGBA::RGBA((RGBA *)&tex0,local_23c);
      tcu::RGBA::toVec((RGBA *)((long)&tex0 + 4));
      tcu::operator*((tcu *)&local_2bc,(Vector<float,_4> *)((long)&tex0 + 4),
                     (Vector<float,_4> *)(cBias.m_data + 2));
      tcu::operator+((tcu *)&local_2ac,&local_2bc,(Vector<float,_4> *)&numLayers);
      tcu::fillWithGrid(&local_268,4,&local_278,&local_2ac);
    }
  }
  glu::TextureCubeArray::upload(this->m_gradientTex);
  glu::TextureCubeArray::upload(this->m_gridTex);
  pTVar6 = this->m_gradientTex;
  local_2e0 = this->m_gridTex;
  tex1 = pTVar6;
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    this_02 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = tcu::RenderTarget::getNumSamples(this_02);
    pTVar6 = tex1;
    local_3c1 = iVar2 == 0;
    if ((bool)local_3c1) {
      tcu::Vector<float,_2>::Vector(&local_3f0,-1.25,-1.2);
      tcu::Vector<float,_2>::Vector(&local_3f8,1.2,1.25);
      tcu::Vector<float,_2>::Vector(&local_400,-0.5,(float)levelSwz[3].m_data[2] + 0.5);
      FilterCase::FilterCase(&local_3e8,pTVar6,&local_3f0,&local_3f8,&local_400);
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::push_back(&this->m_cases,&local_3e8);
    }
    else {
      tcu::Vector<float,_2>::Vector(&local_428,-1.19,-1.3);
      tcu::Vector<float,_2>::Vector(&local_430,1.1,1.35);
      tcu::Vector<float,_2>::Vector(&local_438,-0.5,(float)levelSwz[3].m_data[2] + 0.5);
      FilterCase::FilterCase(&local_420,pTVar6,&local_428,&local_430,&local_438);
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::push_back(&this->m_cases,&local_420);
    }
    pTVar6 = tex1;
    tcu::Vector<float,_2>::Vector(&local_460,0.8,0.8);
    tcu::Vector<float,_2>::Vector(&local_468,1.25,1.2);
    tcu::Vector<float,_2>::Vector(&local_470,-0.5,(float)levelSwz[3].m_data[2] + 0.5);
    FilterCase::FilterCase(&local_458,pTVar6,&local_460,&local_468,&local_470);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_458);
    pTVar6 = local_2e0;
    tcu::Vector<float,_2>::Vector(&local_498,-1.19,-1.3);
    tcu::Vector<float,_2>::Vector(&local_4a0,1.1,1.35);
    tcu::Vector<float,_2>::Vector(&local_4a8,(float)levelSwz[3].m_data[2] + 0.5,-0.5);
    FilterCase::FilterCase(&local_490,pTVar6,&local_498,&local_4a0,&local_4a8);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_490);
    pTVar6 = local_2e0;
    tcu::Vector<float,_2>::Vector(&local_4d0,-1.2,-1.1);
    tcu::Vector<float,_2>::Vector(&local_4d8,-0.8,-0.8);
    tcu::Vector<float,_2>::Vector(&local_4e0,(float)levelSwz[3].m_data[2] + 0.5,-0.5);
    FilterCase::FilterCase(&local_4c8,pTVar6,&local_4d0,&local_4d8,&local_4e0);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_4c8);
    pTVar6 = tex1;
    if (((local_3c1 & 1) != 0) && (1 < levelSwz[3].m_data[2])) {
      tcu::Vector<float,_2>::Vector(&local_508,-2.0,-1.5);
      tcu::Vector<float,_2>::Vector(&local_510,-0.1,0.9);
      tcu::Vector<float,_2>::Vector(&local_518,1.50001,1.49999);
      FilterCase::FilterCase(&local_500,pTVar6,&local_508,&local_510,&local_518);
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::push_back(&this->m_cases,&local_500);
    }
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_308,-0.8,-0.8);
    tcu::Vector<float,_2>::Vector(&local_310,0.8,0.8);
    tcu::Vector<float,_2>::Vector(&local_318,-0.5,(float)levelSwz[3].m_data[2] + 0.5);
    FilterCase::FilterCase(&local_300,pTVar6,&local_308,&local_310,&local_318);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_300);
    pTVar6 = tex1;
    tcu::Vector<float,_2>::Vector(&local_340,0.5,0.65);
    tcu::Vector<float,_2>::Vector(&local_348,0.8,0.8);
    tcu::Vector<float,_2>::Vector(&local_350,-0.5,(float)levelSwz[3].m_data[2] + 0.5);
    FilterCase::FilterCase(&local_338,pTVar6,&local_340,&local_348,&local_350);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_338);
    pTVar6 = local_2e0;
    tcu::Vector<float,_2>::Vector(&local_378,-0.8,-0.8);
    tcu::Vector<float,_2>::Vector(&local_380,0.8,0.8);
    tcu::Vector<float,_2>::Vector(&local_388,(float)levelSwz[3].m_data[2] + 0.5,-0.5);
    FilterCase::FilterCase(&local_370,pTVar6,&local_378,&local_380,&local_388);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_370);
    pTVar6 = local_2e0;
    tcu::Vector<float,_2>::Vector(&local_3b0,0.2,0.2);
    tcu::Vector<float,_2>::Vector(&local_3b8,0.6,0.5);
    tcu::Vector<float,_2>::Vector
              ((Vector<float,_2> *)&stack0xfffffffffffffc40,(float)levelSwz[3].m_data[2] + 0.5,-0.5)
    ;
    FilterCase::FilterCase(&local_3a8,pTVar6,&local_3b0,&local_3b8,(Vec2 *)&stack0xfffffffffffffc40)
    ;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_3a8);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void TextureCubeArrayFilteringCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_cube_map_array"))
		throw tcu::NotSupportedError("GL_EXT_texture_cube_map_array not supported");

	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(m_size) + 1;
		const int						numLayers	= m_depth / 6;

		// Create textures.
		m_gradientTex	= new glu::TextureCubeArray(m_context.getRenderContext(), m_internalFormat, m_size, m_depth);
		m_gridTex		= new glu::TextureCubeArray(m_context.getRenderContext(), m_internalFormat, m_size, m_depth);

		const tcu::IVec4 levelSwz[] =
		{
			tcu::IVec4(0,1,2,3),
			tcu::IVec4(2,1,3,0),
			tcu::IVec4(3,0,1,2),
			tcu::IVec4(1,3,2,0),
		};

		// Fill first gradient texture (gradient direction varies between layers).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gradientTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gradientTex->getRefTexture().getLevel(levelNdx);

			for (int layerFaceNdx = 0; layerFaceNdx < m_depth; layerFaceNdx++)
			{
				const tcu::IVec4	swz		= levelSwz[layerFaceNdx % DE_LENGTH_OF_ARRAY(levelSwz)];
				const tcu::Vec4		gMin	= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;
				const tcu::Vec4		gMax	= tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;

				tcu::fillWithComponentGradients(tcu::getSubregion(levelBuf, 0, 0, layerFaceNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1), gMin, gMax);
			}
		}

		// Fill second with grid texture (each layer has unique colors).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gridTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gridTex->getRefTexture().getLevel(levelNdx);

			for (int layerFaceNdx = 0; layerFaceNdx < m_depth; layerFaceNdx++)
			{
				const deUint32	step	= 0x00ffffff / (numLevels*m_depth - 1);
				const deUint32	rgb		= step * (levelNdx + layerFaceNdx*numLevels);
				const deUint32	colorA	= 0xff000000 | rgb;
				const deUint32	colorB	= 0xff000000 | ~rgb;

				tcu::fillWithGrid(tcu::getSubregion(levelBuf, 0, 0, layerFaceNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1),
								  4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		{
			const glu::TextureCubeArray* const	tex0	= m_gradientTex;
			const glu::TextureCubeArray* const	tex1	= m_gridTex;

			if (m_onlySampleFaceInterior)
			{
				m_cases.push_back(FilterCase(tex0, tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// minification
				m_cases.push_back(FilterCase(tex0, tcu::Vec2(0.5f, 0.65f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// magnification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// minification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(0.2f, 0.2f),	tcu::Vec2(0.6f,  0.5f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// magnification
			}
			else
			{
				const bool isSingleSample = (m_context.getRenderTarget().getNumSamples() == 0);

				// minification - w/ tweak to avoid hitting triangle edges with a face switchpoint in multisample configs
				if (isSingleSample)
					m_cases.push_back(FilterCase(tex0, tcu::Vec2(-1.25f, -1.2f), tcu::Vec2(1.2f, 1.25f), tcu::Vec2(-0.5f, float(numLayers)+0.5f)));
				else
					m_cases.push_back(FilterCase(tex0, tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f), tcu::Vec2(-0.5f, float(numLayers)+0.5f)));

				m_cases.push_back(FilterCase(tex0, tcu::Vec2(0.8f, 0.8f),		tcu::Vec2(1.25f, 1.20f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// magnification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-1.19f, -1.3f),	tcu::Vec2(1.1f, 1.35f),		tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// minification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-1.2f, -1.1f),		tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// magnification

				// Layer rounding - only in single-sample configs as multisample configs may produce smooth transition at the middle.
				if (isSingleSample && (numLayers > 1))
					m_cases.push_back(FilterCase(tex0,	tcu::Vec2(-2.0f, -1.5f  ),	tcu::Vec2(-0.1f,  0.9f), tcu::Vec2(1.50001f, 1.49999f)));
			}
		}

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		TextureCubeArrayFilteringCase::deinit();
		throw;
	}
}